

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_sign(wally_psbt *psbt,uchar *key,size_t key_len,uint32_t flags)

{
  size_t value_len;
  uchar uVar1;
  int iVar2;
  uint uVar3;
  wally_psbt_input *pwVar4;
  wally_tx *tx;
  uint64_t *puVar5;
  size_t pub_key_len;
  _Bool _Var6;
  int iVar7;
  long lVar8;
  uchar *puVar9;
  long lVar10;
  size_t index;
  uchar *puVar11;
  uint32_t sighash;
  long lVar12;
  wally_map *pwVar13;
  long lVar14;
  size_t local_1d0;
  size_t scriptcode_len;
  size_t keypath_index;
  wally_tx_input *local_1b8;
  size_t written;
  uint local_1a8;
  uint32_t local_1a4;
  size_t is_found;
  uchar *local_198;
  wally_map *local_190;
  uchar signature_hash [32];
  uchar pubkey [33];
  size_t type;
  uchar p2sh [23];
  uchar full_pubkey [65];
  uchar wpkh_sc [25];
  
  iVar7 = -2;
  if ((((psbt != (wally_psbt *)0x0) && (key != (uchar *)0x0)) && (flags < 0x10)) &&
     ((key_len == 0x20 && (psbt->tx != (wally_tx *)0x0)))) {
    iVar2 = *(int *)psbt->magic;
    uVar1 = psbt->magic[4];
    iVar7 = wally_ec_public_key_from_private_key(key,0x20,pubkey,0x21);
    if ((iVar7 == 0) &&
       (iVar7 = wally_ec_public_key_decompress(pubkey,0x21,full_pubkey,0x41), iVar7 == 0)) {
      local_1d0 = psbt->num_inputs;
      if (local_1d0 == 0) {
        iVar7 = 0;
      }
      else {
        local_1a8 = (uint)(uVar1 != 0xff || iVar2 != 0x74657370);
        local_1a4 = (flags & 4) + 1;
        lVar12 = 0x48;
        lVar10 = 0;
        index = 0;
        local_198 = key;
        do {
          pwVar4 = psbt->inputs;
          local_1b8 = psbt->tx->inputs;
          keypath_index = 0;
          pwVar13 = (wally_map *)((long)&pwVar4->utxo + lVar12);
          iVar7 = wally_map_find(pwVar13,full_pubkey,0x41,&keypath_index);
          if ((iVar7 == 0) && (keypath_index == 0)) {
            iVar7 = wally_map_find(pwVar13,pubkey,0x21,&keypath_index);
          }
          if ((iVar7 == 0) && (keypath_index != 0)) {
            keypath_index = keypath_index - 1;
            pwVar13 = (wally_map *)((long)&pwVar4->redeem_script_len + lVar12);
            iVar7 = wally_map_find(pwVar13,full_pubkey,0x41,&is_found);
            local_190 = pwVar13;
            if (is_found == 0 && iVar7 == 0) {
              iVar7 = wally_map_find(pwVar13,pubkey,0x21,&is_found);
            }
            if ((iVar7 == 0) && (is_found == 0)) {
              if (pwVar4 == (wally_psbt_input *)0x0) {
                return -2;
              }
              scriptcode_len = 0;
              lVar14 = *(long *)((long)pwVar4 + lVar12 + -0x48);
              if (lVar14 == 0) {
                lVar14 = 0;
              }
              else {
                if (*(ulong *)(lVar14 + 0x28) <= (ulong)*(uint *)(local_1b8->txhash + lVar10 + 0x20)
                   ) {
                  return -2;
                }
                lVar14 = (ulong)*(uint *)(local_1b8->txhash + lVar10 + 0x20) * 0x70 +
                         *(long *)(lVar14 + 0x20);
              }
              lVar8 = *(long *)((long)pwVar4 + lVar12 + -0x40);
              if (lVar8 != 0) {
                lVar14 = lVar8;
              }
              if (lVar14 == 0) {
                return -2;
              }
              puVar11 = *(uchar **)((long)pwVar4 + lVar12 + -0x38);
              if (puVar11 == (uchar *)0x0) {
                puVar11 = *(uchar **)(lVar14 + 8);
                scriptcode_len = *(size_t *)(lVar14 + 0x10);
              }
              else {
                iVar7 = wally_scriptpubkey_p2sh_from_bytes
                                  (puVar11,*(size_t *)((long)pwVar4 + lVar12 + -0x30),1,p2sh,0x17,
                                   &type);
                if (iVar7 != 0) {
                  return -2;
                }
                if (*(size_t *)(lVar14 + 0x10) != type) {
                  return -2;
                }
                iVar7 = bcmp(p2sh,*(void **)(lVar14 + 8),*(size_t *)(lVar14 + 0x10));
                if (iVar7 != 0) {
                  return -2;
                }
                puVar11 = *(uchar **)((long)pwVar4 + lVar12 + -0x38);
                scriptcode_len = *(size_t *)((long)pwVar4 + lVar12 + -0x30);
                lVar8 = *(long *)((long)pwVar4 + lVar12 + -0x40);
              }
              iVar7 = *(int *)((long)&(pwVar4->keypaths).items + lVar12);
              sighash = iVar7 + (uint)(iVar7 == 0);
              if (lVar8 == 0) {
                tx = *(wally_tx **)((long)pwVar4 + lVar12 + -0x48);
                if (tx != (wally_tx *)0x0) {
                  _Var6 = is_matching_txid(tx,local_1b8->txhash + lVar10,(size_t)&type);
                  if (!_Var6) {
                    return -2;
                  }
                  iVar7 = wally_tx_get_btc_signature_hash
                                    (psbt->tx,index,puVar11,scriptcode_len,0,sighash,0,
                                     signature_hash,0x20);
                  goto joined_r0x004ea6c0;
                }
              }
              else {
                iVar7 = wally_scriptpubkey_get_type(puVar11,scriptcode_len,&type);
                if (iVar7 != 0) {
                  return iVar7;
                }
                if (type == 0x10) {
                  puVar9 = *(uchar **)((long)pwVar4 + lVar12 + -0x28);
                  if (puVar9 == (uchar *)0x0) {
                    return -2;
                  }
                  iVar7 = wally_witness_program_from_bytes
                                    (puVar9,*(size_t *)((long)pwVar4 + lVar12 + -0x20),2,p2sh,0x22,
                                     &written);
                  if (iVar7 != 0) {
                    return iVar7;
                  }
                  if (scriptcode_len != 0x22) {
                    return -2;
                  }
                  iVar7 = bcmp(p2sh,puVar11,0x22);
                  if (iVar7 != 0) {
                    return -2;
                  }
                  puVar9 = *(uchar **)((long)pwVar4 + lVar12 + -0x28);
                  scriptcode_len = *(size_t *)((long)pwVar4 + lVar12 + -0x20);
                }
                else {
                  if (type != 8) {
                    return -2;
                  }
                  puVar9 = wpkh_sc;
                  iVar7 = wally_scriptpubkey_p2pkh_from_bytes
                                    (puVar11 + 2,0x14,0,puVar9,0x19,&scriptcode_len);
                  if (iVar7 != 0) {
                    return iVar7;
                  }
                }
                puVar5 = *(uint64_t **)((long)pwVar4 + lVar12 + -0x40);
                if (local_1a8 == 0) {
                  iVar7 = wally_tx_get_elements_signature_hash
                                    (psbt->tx,index,puVar9,scriptcode_len,(uchar *)puVar5[6],
                                     puVar5[7],sighash,1,signature_hash,0x20);
                }
                else {
                  iVar7 = wally_tx_get_btc_signature_hash
                                    (psbt->tx,index,puVar9,scriptcode_len,*puVar5,sighash,1,
                                     signature_hash,0x20);
                }
joined_r0x004ea6c0:
                if (iVar7 != 0) {
                  return iVar7;
                }
              }
              lVar14 = *(long *)((long)&pwVar4->utxo + lVar12);
              local_1b8 = *(wally_tx_input **)(lVar14 + keypath_index * 0x20);
              pub_key_len = *(size_t *)(lVar14 + 8 + keypath_index * 0x20);
              uVar3 = *(uint *)((long)&(pwVar4->keypaths).items + lVar12);
              iVar7 = wally_ec_public_key_verify(local_1b8->txhash,pub_key_len);
              if (0xff < uVar3) {
                return -2;
              }
              if (iVar7 != 0) {
                return -2;
              }
              iVar7 = wally_ec_sig_from_bytes
                                (local_198,0x20,signature_hash,0x20,local_1a4,(uchar *)&type,0x40);
              if (iVar7 != 0) {
                return iVar7;
              }
              iVar7 = wally_ec_sig_to_der((uchar *)&type,0x40,p2sh,0x49,&written);
              if (iVar7 != 0) {
                return iVar7;
              }
              value_len = written + 1;
              p2sh[written] = (char)uVar3 + (uVar3 == 0);
              written = value_len;
              iVar7 = map_add(local_190,local_1b8->txhash,pub_key_len,p2sh,value_len,false,
                              (_func_int_uchar_ptr_size_t *)0x0,true);
              wally_clear_2(&type,0x40,p2sh,0x49);
              if (iVar7 != 0) {
                return iVar7;
              }
              local_1d0 = psbt->num_inputs;
            }
          }
          index = index + 1;
          lVar10 = lVar10 + 0xd0;
          lVar12 = lVar12 + 0x110;
          iVar7 = 0;
        } while (index < local_1d0);
      }
    }
  }
  return iVar7;
}

Assistant:

int wally_psbt_sign(struct wally_psbt *psbt,
                    const unsigned char *key, size_t key_len, uint32_t flags)
{
    unsigned char pubkey[EC_PUBLIC_KEY_LEN], full_pubkey[EC_PUBLIC_KEY_UNCOMPRESSED_LEN];
    const size_t pubkey_len = sizeof(pubkey), full_pubkey_len = sizeof(full_pubkey);
    unsigned char wpkh_sc[WALLY_SCRIPTPUBKEY_P2PKH_LEN];
    size_t is_elements, i;
    int ret;

    if (!psbt || !psbt->tx || !key || key_len != EC_PRIVATE_KEY_LEN ||
        (flags & ~EC_FLAGS_ALL)) {
        return WALLY_EINVAL;
    }

    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;
#ifndef BUILD_ELEMENTS
    if (is_elements)
        return WALLY_EINVAL;
#endif /* ndef BUILD_ELEMENTS */

    /* Get the pubkey */
    ret = wally_ec_public_key_from_private_key(key, key_len,
                                               pubkey, pubkey_len);
    if (ret == WALLY_OK)
        ret = wally_ec_public_key_decompress(pubkey, pubkey_len,
                                             full_pubkey, full_pubkey_len);
    if (ret != WALLY_OK)
        return ret;

    /* Go through each of the inputs */
    for (i = 0; i < psbt->num_inputs; ++i) {
        struct wally_psbt_input *input = &psbt->inputs[i];
        struct wally_tx_input *txin = &psbt->tx->inputs[i];
        unsigned char signature_hash[SHA256_LEN];
        const unsigned char *scriptcode;
        size_t keypath_index = 0, scriptcode_len;
        uint32_t sighash;

        /* See if this input has a keypath matching the pubkey of the private key supplied */
        ret = wally_map_find(&input->keypaths, full_pubkey, full_pubkey_len, &keypath_index);
        if (ret == WALLY_OK && !keypath_index)
            ret = wally_map_find(&input->keypaths, pubkey, pubkey_len, &keypath_index);
        if (ret != WALLY_OK)
            continue;

        if (!keypath_index)
            continue; /* Didn't find a keypath matching this pubkey: skip it */
        keypath_index -= 1; /* Use 0 based index below */

        /* Make sure we don't already have a sig for this input */
        size_t is_found;
        ret = wally_map_find(&input->signatures, full_pubkey, full_pubkey_len, &is_found);
        if (ret == WALLY_OK && !is_found)
            ret = wally_map_find(&input->signatures, pubkey, pubkey_len, &is_found);

        if (ret != WALLY_OK || is_found)
            continue; /* Already got a partial sig for this pubkey on this input */

        /* From this point, any failure to sign returns an error, since we
        * have the key to sign this input we are expected to be able to */

        if (!input_get_scriptcode(input, txin->index, &scriptcode, &scriptcode_len))
            return WALLY_EINVAL; /* Couldn't find the script to sign with */

        sighash = input->sighash ? input->sighash : WALLY_SIGHASH_ALL;

        if (input->witness_utxo) {
            size_t type;

            ret = wally_scriptpubkey_get_type(scriptcode, scriptcode_len, &type);
            if (ret != WALLY_OK)
                return ret;

            if (type == WALLY_SCRIPT_TYPE_P2WPKH) {
                ret = wally_scriptpubkey_p2pkh_from_bytes(&scriptcode[2],
                                                          HASH160_LEN, 0,
                                                          wpkh_sc, sizeof(wpkh_sc),
                                                          &scriptcode_len);
                if (ret != WALLY_OK)
                    return ret;

                scriptcode = wpkh_sc;
            } else if (type == WALLY_SCRIPT_TYPE_P2WSH && input->witness_script) {
                unsigned char p2wsh[WALLY_SCRIPTPUBKEY_P2WSH_LEN];
                size_t written;

                ret = wally_witness_program_from_bytes(input->witness_script,
                                                       input->witness_script_len,
                                                       WALLY_SCRIPT_SHA256,
                                                       p2wsh, sizeof(p2wsh),
                                                       &written);
                if (ret != WALLY_OK)
                    return ret;

                if (scriptcode_len != sizeof(p2wsh) ||
                    memcmp(p2wsh, scriptcode, sizeof(p2wsh)))
                    return WALLY_EINVAL;

                scriptcode = input->witness_script;
                scriptcode_len = input->witness_script_len;
            } else
                return WALLY_EINVAL; /* Unknown scriptPubKey type/not enough info */

#ifdef BUILD_ELEMENTS
            if (is_elements)
                ret = wally_tx_get_elements_signature_hash(psbt->tx, i,
                                                           scriptcode, scriptcode_len,
                                                           input->witness_utxo->value,
                                                           input->witness_utxo->value_len,
                                                           sighash,
                                                           WALLY_TX_FLAG_USE_WITNESS,
                                                           signature_hash, SHA256_LEN);
            else
#endif /* BUILD_ELEMENTS */
            ret = wally_tx_get_btc_signature_hash(psbt->tx, i,
                                                  scriptcode, scriptcode_len,
                                                  input->witness_utxo->satoshi,
                                                  sighash,
                                                  WALLY_TX_FLAG_USE_WITNESS,
                                                  signature_hash, SHA256_LEN);
            if (ret != WALLY_OK)
                return ret;
        } else if (input->utxo) {
            if (!is_matching_txid(input->utxo,
                                  txin->txhash, sizeof(txin->txhash)))
                return WALLY_EINVAL; /* prevout doesn't match this input */

            ret = wally_tx_get_btc_signature_hash(psbt->tx, i,
                                                  scriptcode, scriptcode_len,
                                                  0, sighash, 0,
                                                  signature_hash, SHA256_LEN);
            if (ret != WALLY_OK)
                return ret;
        }

        ret = psbt_input_sign(input, key, key_len,
                              input->keypaths.items[keypath_index].key,
                              input->keypaths.items[keypath_index].key_len,
                              signature_hash, SHA256_LEN, flags);
        if (ret != WALLY_OK)
            return ret;
    }

    return WALLY_OK;
}